

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O0

value_t __thiscall
directed_flag_complex_computer::directed_flag_complex_computer_t::filtration
          (directed_flag_complex_computer_t *this,int dimension,index_t index)

{
  reference pvVar1;
  const_reference pvVar2;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  value_type local_4;
  
  if (in_RDI[1] == 0) {
    local_4 = 0.0;
  }
  else if (in_ESI == 0) {
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(*in_RDI + 0xa8),(long)in_EDX);
    local_4 = *pvVar1;
  }
  else if (in_ESI == 1) {
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(*in_RDI + 0xc0),(long)in_EDX);
    local_4 = *pvVar1;
  }
  else {
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xd),(long)in_EDX);
    local_4 = *pvVar2;
  }
  return local_4;
}

Assistant:

inline value_t filtration(int dimension, index_t index) const {
		// Only return something if we have a non-trivial filtration algorithm
		if (filtration_algorithm == nullptr) return 0.0f;

		if (dimension == 0) return graph.vertex_filtration[index];

		assert(dimension == current_dimension + 1);
		if (dimension == 1) return graph.edge_filtration[index];

		return next_filtration[index];
	}